

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool adios2sys::SystemTools::ParseURL
               (string *URL,string *protocol,string *username,string *password,string *hostname,
               string *dataport,string *database,bool decode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *url;
  string *url_00;
  bool bVar2;
  RegularExpression urlRe;
  string local_290;
  string *local_270;
  string *local_268;
  RegularExpression local_260;
  
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  local_270 = dataport;
  local_268 = hostname;
  memset(&local_260,0,0x20a);
  RegularExpression::compile
            (&local_260,"([a-zA-Z0-9]*)://(([A-Za-z0-9]+)(:([^:@]+))?@)?([^:@/]*)(:([0-9]+))?/(.+)?"
            );
  bVar2 = RegularExpression::find(&local_260,(URL->_M_dataplus)._M_p,&local_260.regmatch);
  if (bVar2) {
    paVar1 = &local_290.field_2;
    local_290._M_dataplus._M_p = (pointer)paVar1;
    if (local_260.regmatch.startp[1] == (char *)0x0) {
      local_290._M_string_length = 0;
      local_290.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,local_260.regmatch.startp[1],local_260.regmatch.endp[1]);
    }
    std::__cxx11::string::operator=((string *)protocol,(string *)&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if (local_260.regmatch.startp[3] == (char *)0x0) {
      local_290._M_string_length = 0;
      local_290.field_2._M_local_buf[0] = '\0';
      local_290._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_290._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,local_260.regmatch.startp[3],local_260.regmatch.endp[3]);
    }
    std::__cxx11::string::operator=((string *)username,(string *)&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if (local_260.regmatch.startp[5] == (char *)0x0) {
      local_290._M_string_length = 0;
      local_290.field_2._M_local_buf[0] = '\0';
      local_290._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_290._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,local_260.regmatch.startp[5],local_260.regmatch.endp[5]);
    }
    std::__cxx11::string::operator=((string *)password,(string *)&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if (local_260.regmatch.startp[6] == (char *)0x0) {
      local_290._M_string_length = 0;
      local_290.field_2._M_local_buf[0] = '\0';
      local_290._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_290._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,local_260.regmatch.startp[6],local_260.regmatch.endp[6]);
    }
    std::__cxx11::string::operator=((string *)local_268,(string *)&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if (local_260.regmatch.startp[8] == (char *)0x0) {
      local_290._M_string_length = 0;
      local_290.field_2._M_local_buf[0] = '\0';
      local_290._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_290._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,local_260.regmatch.startp[8],local_260.regmatch.endp[8]);
    }
    std::__cxx11::string::operator=((string *)local_270,(string *)&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if (local_260.regmatch.startp[9] == (char *)0x0) {
      local_290._M_string_length = 0;
      local_290.field_2._M_local_buf[0] = '\0';
      local_290._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_290._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,local_260.regmatch.startp[9],local_260.regmatch.endp[9]);
    }
    std::__cxx11::string::operator=((string *)database,(string *)&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if (decode) {
      DecodeURL(&local_290,username);
      std::__cxx11::string::operator=((string *)username,(string *)&local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      DecodeURL(&local_290,password);
      url_00 = local_268;
      std::__cxx11::string::operator=((string *)password,(string *)&local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      DecodeURL(&local_290,url_00);
      url = local_270;
      std::__cxx11::string::operator=((string *)url_00,(string *)&local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      DecodeURL(&local_290,url);
      std::__cxx11::string::operator=((string *)url,(string *)&local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      DecodeURL(&local_290,database);
      std::__cxx11::string::operator=((string *)database,(string *)&local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar1) {
        operator_delete(local_290._M_dataplus._M_p);
      }
    }
  }
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  return bVar2;
}

Assistant:

bool SystemTools::ParseURL(const std::string& URL, std::string& protocol,
                           std::string& username, std::string& password,
                           std::string& hostname, std::string& dataport,
                           std::string& database, bool decode)
{
  kwsys::RegularExpression urlRe(VTK_URL_REGEX);
  if (!urlRe.find(URL))
    return false;

  // match 0 URL
  // match 1 protocol
  // match 2 mangled user
  // match 3 username
  // match 4 mangled password
  // match 5 password
  // match 6 hostname
  // match 7 mangled port
  // match 8 dataport
  // match 9 database name

  protocol = urlRe.match(1);
  username = urlRe.match(3);
  password = urlRe.match(5);
  hostname = urlRe.match(6);
  dataport = urlRe.match(8);
  database = urlRe.match(9);

  if (decode) {
    username = DecodeURL(username);
    password = DecodeURL(password);
    hostname = DecodeURL(hostname);
    dataport = DecodeURL(dataport);
    database = DecodeURL(database);
  }

  return true;
}